

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg.h
# Opt level: O1

void __thiscall spdlog::details::log_msg::log_msg(log_msg *this,string *loggers_name,level_enum lvl)

{
  rep rVar1;
  long in_FS_OFFSET;
  
  this->logger_name = loggers_name;
  this->level = lvl;
  (this->time).__d.__r = 0;
  (this->raw).super_BasicWriter<char>.buffer_ = &(this->raw).buffer_.super_Buffer<char>;
  (this->raw).super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_001b0dd8;
  (this->raw).buffer_.super_Buffer<char>.ptr_ = (this->raw).buffer_.data_;
  (this->raw).buffer_.super_Buffer<char>.size_ = 0;
  (this->raw).buffer_.super_Buffer<char>.capacity_ = 500;
  (this->raw).buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_001b0e40;
  (this->formatted).super_BasicWriter<char>.buffer_ = &(this->formatted).buffer_.super_Buffer<char>;
  (this->formatted).super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_001b0dd8;
  (this->formatted).buffer_.super_Buffer<char>.ptr_ = (this->formatted).buffer_.data_;
  (this->formatted).buffer_.super_Buffer<char>.size_ = 0;
  (this->formatted).buffer_.super_Buffer<char>.capacity_ = 500;
  (this->formatted).buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_001b0e40;
  this->msg_id = 0;
  this->color_range_start = 0;
  this->color_range_end = 0;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->time).__d.__r = rVar1;
  if (*(char *)(in_FS_OFFSET + -8) == '\0') {
    details::log_msg();
  }
  this->thread_id = *(size_t *)(in_FS_OFFSET + -0x10);
  return;
}

Assistant:

log_msg(const std::string *loggers_name, level::level_enum lvl)
        : logger_name(loggers_name)
        , level(lvl)
    {
#ifndef SPDLOG_NO_DATETIME
        time = os::now();
#endif

#ifndef SPDLOG_NO_THREAD_ID
        thread_id = os::thread_id();
#endif
    }